

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

shared_ptr<duckdb::ParquetFileMetadataCache,_true> __thiscall
duckdb::LoadMetadata
          (duckdb *this,ClientContext *context,Allocator *allocator,CachingFileHandle *file_handle,
          shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *encryption_config,
          EncryptionUtil *encryption_util,optional_idx footer_size)

{
  ulong file_size;
  data_ptr_t pdVar1;
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
  this_00;
  bool bVar2;
  long lVar3;
  pointer pTVar4;
  idx_t iVar5;
  ReadHead *pRVar6;
  InvalidInputException *pIVar7;
  uint64_t len;
  pointer pFVar8;
  type pFVar9;
  type iprot;
  ParquetEncryptionConfig *this_01;
  string *key;
  pointer pFVar10;
  size_t __nbytes;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  uint32_t uVar12;
  ulong uVar13;
  idx_t pos;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> sVar14;
  bool footer_encrypted;
  allocator local_111;
  uint32_t read_footer_len;
  undefined4 uStack_10c;
  _Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false> local_108;
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
  geo_metadata;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  AllocatedData local_f0 [32];
  optional_ptr<duckdb::ReadHead,_true> read_head;
  time_t current_time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  __nbytes = 1000000000;
  current_time = lVar3 / 1000000000;
  CreateThriftFileProtocol((CachingFileHandle *)&local_108,SUB81(file_handle,0));
  pTVar4 = unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
           ::operator->((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                         *)&local_108);
  std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                *)&geo_metadata,
               &(pTVar4->ptrans_).
                super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              );
  this_00 = geo_metadata;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  file_size = *(ulong *)((long)this_00.
                               super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                               .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>.
                               _M_head_impl + 0x18);
  if (file_size < 0xc) {
    pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&geo_metadata,"File \'%s\' too small to be a Parquet file",
               (allocator *)&read_head);
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar7,(string *)&geo_metadata,&local_50);
    __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (footer_size.index == 0xffffffffffffffff) {
    bVar2 = ShouldAndCanPrefetch(context,file_handle);
    if (bVar2) {
      __nbytes = 1000;
      uVar13 = 0x4000;
      if (0x4000 < file_size / 1000) {
        uVar13 = file_size / 1000;
      }
      if (0x3ffff < uVar13) {
        uVar13 = 0x40000;
      }
      len = duckdb::NextPowerOfTwo(uVar13);
      if (file_size <= len) {
        len = file_size;
      }
    }
    else {
      len = 8;
    }
    ResizeableBuffer::ResizeableBuffer((ResizeableBuffer *)&geo_metadata);
    ResizeableBuffer::resize((ResizeableBuffer *)&geo_metadata,allocator,8);
    memset((void *)geo_metadata.
                   super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                   .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,0,
           (size_t)local_f8._M_pi);
    ThriftFileTransport::Prefetch
              ((ThriftFileTransport *)
               this_00.
               super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,
               file_size - len,len);
    *(ulong *)((long)this_00.
                     super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl +
              0x10) = file_size - 8;
    ThriftFileTransport::read
              ((ThriftFileTransport *)
               this_00.
               super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,
               (int)geo_metadata.
                    super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                    .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,
               (void *)0x8,__nbytes);
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    ParseParquetFooter((data_ptr_t)
                       geo_metadata.
                       super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                       .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,
                       (string *)&read_head,file_size,encryption_config,&read_footer_len,
                       &footer_encrypted);
    std::__cxx11::string::~string((string *)&read_head);
    iVar5 = file_size - (read_footer_len + 8);
    *(idx_t *)((long)this_00.
                     super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl +
              0x10) = iVar5;
    if (len - 8 < (ulong)read_footer_len) {
      ThriftFileTransport::Prefetch
                ((ThriftFileTransport *)
                 this_00.
                 super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                 .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,iVar5,
                 (ulong)read_footer_len);
    }
    duckdb::AllocatedData::~AllocatedData(local_f0);
  }
  else {
    iVar5 = optional_idx::GetIndex(&footer_size);
    uVar12 = (uint32_t)iVar5;
    if ((uVar12 == 0) || (file_size < uVar12 + 0xc)) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&geo_metadata,"Invalid footer length provided for file \'%s\'",
                 (allocator *)&read_head);
      duckdb::CachingFileHandle::GetPath_abi_cxx11_();
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar7,(string *)&geo_metadata,&local_70);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    pos = file_size - (uVar12 + 8);
    *(idx_t *)((long)this_00.
                     super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                     .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl +
              0x10) = pos;
    ThriftFileTransport::Prefetch
              ((ThriftFileTransport *)
               this_00.
               super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl,pos,
               (ulong)(uVar12 + 8));
    read_head.ptr =
         ReadAheadBuffer::GetReadHead
                   ((ReadAheadBuffer *)
                    ((long)this_00.
                           super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                           .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>.
                           _M_head_impl + 0x20),pos);
    pRVar6 = optional_ptr<duckdb::ReadHead,_true>::operator->(&read_head);
    pdVar1 = pRVar6->buffer_ptr;
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    ParseParquetFooter(pdVar1 + (iVar5 & 0xffffffff),(string *)&geo_metadata,file_size,
                       encryption_config,&read_footer_len,&footer_encrypted);
    std::__cxx11::string::~string((string *)&geo_metadata);
    if (read_footer_len != uVar12) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&geo_metadata,
                 "Parquet footer length stored in file is not equal to footer length provided",
                 &local_111);
      duckdb::InvalidInputException::InvalidInputException(pIVar7,(string *)&geo_metadata);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  make_uniq<duckdb_parquet::FileMetaData>();
  if (footer_encrypted == true) {
    make_uniq<duckdb_parquet::FileCryptoMetaData>();
    pFVar8 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
             ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                           *)&read_footer_len);
    (**(code **)(*(long *)pFVar8 + 0x10))(pFVar8,local_108._M_head_impl);
    pFVar8 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
             ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                           *)&read_footer_len);
    if (((byte)(pFVar8->encryption_algorithm).__isset & 2) != 0) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&geo_metadata,
                 "File \'%s\' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
                 &local_111);
      duckdb::CachingFileHandle::GetPath_abi_cxx11_();
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar7,(string *)&geo_metadata,&local_90);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    pFVar9 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
             ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                          *)&read_head);
    lVar3 = *(long *)(*(long *)pFVar9 + -0x30);
    iprot = unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
            ::operator*((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                         *)&local_108);
    this_01 = shared_ptr<const_duckdb::ParquetEncryptionConfig,_true>::operator->(encryption_config)
    ;
    key = ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_01);
    ParquetCrypto::Read((TBase *)(&pFVar9->field_0x0 + lVar3),iprot,key,encryption_util);
    if ((long *)CONCAT44(uStack_10c,read_footer_len) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_10c,read_footer_len) + 8))();
    }
  }
  else {
    pFVar10 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
              ::operator->((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                            *)&read_head);
    (**(code **)(*(long *)pFVar10 + 0x10))(pFVar10,local_108._M_head_impl);
  }
  pFVar9 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
           ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                        *)&read_head);
  GeoParquetFileMetadata::TryRead((GeoParquetFileMetadata *)&geo_metadata,pFVar9,context);
  make_shared_ptr<duckdb::ParquetFileMetadataCache,duckdb::unique_ptr<duckdb_parquet::FileMetaData,std::default_delete<duckdb_parquet::FileMetaData>,true>,long&,duckdb::unique_ptr<duckdb::GeoParquetFileMetadata,std::default_delete<duckdb::GeoParquetFileMetadata>,true>>
            ((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
              *)this,(long *)&read_head,
             (unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
              *)&current_time);
  std::
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>::
  ~unique_ptr(&geo_metadata.
               super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
             );
  _Var11._M_pi = extraout_RDX;
  if (read_head.ptr != (ReadHead *)0x0) {
    (**(code **)((read_head.ptr)->location + 8))();
    _Var11._M_pi = extraout_RDX_00;
  }
  if (local_108._M_head_impl != (TProtocol *)0x0) {
    (*(local_108._M_head_impl)->_vptr_TProtocol[1])();
    _Var11._M_pi = extraout_RDX_01;
  }
  sVar14.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var11._M_pi;
  sVar14.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<duckdb::ParquetFileMetadataCache,_true>)
         sVar14.internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static shared_ptr<ParquetFileMetadataCache>
LoadMetadata(ClientContext &context, Allocator &allocator, CachingFileHandle &file_handle,
             const shared_ptr<const ParquetEncryptionConfig> &encryption_config, const EncryptionUtil &encryption_util,
             optional_idx footer_size) {
	auto current_time = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());

	auto file_proto = CreateThriftFileProtocol(file_handle, false);
	auto &transport = reinterpret_cast<ThriftFileTransport &>(*file_proto->getTransport());
	auto file_size = transport.GetSize();
	if (file_size < 12) {
		throw InvalidInputException("File '%s' too small to be a Parquet file", file_handle.GetPath());
	}

	bool footer_encrypted;
	// footer size is not provided - read it from the back
	if (!footer_size.IsValid()) {
		// We have to do two reads here:
		// 1. The 8 bytes from the back to check if it's a Parquet file and the footer size
		// 2. The footer (after getting the size)
		// For local reads this doesn't matter much, but for remote reads this means two round trips,
		// which is especially bad for small Parquet files where the read cost is mostly round trips.
		// So, we prefetch more, to hopefully save a round trip.
		static constexpr idx_t ESTIMATED_FOOTER_RATIO = 1000; // Estimate 1/1000th of the file to be footer
		static constexpr idx_t MIN_PREFETCH_SIZE = 16384;     // Prefetch at least this many bytes
		static constexpr idx_t MAX_PREFETCH_SIZE = 262144;    // Prefetch at most this many bytes
		idx_t prefetch_size = 8;
		if (ShouldAndCanPrefetch(context, file_handle)) {
			prefetch_size = ClampValue(file_size / ESTIMATED_FOOTER_RATIO, MIN_PREFETCH_SIZE, MAX_PREFETCH_SIZE);
			prefetch_size = MinValue(NextPowerOfTwo(prefetch_size), file_size);
		}

		ResizeableBuffer buf;
		buf.resize(allocator, 8);
		buf.zero();

		transport.Prefetch(file_size - prefetch_size, prefetch_size);
		transport.SetLocation(file_size - 8);
		transport.read(buf.ptr, 8);

		uint32_t footer_len;
		ParseParquetFooter(buf.ptr, file_handle.GetPath(), file_size, encryption_config, footer_len, footer_encrypted);

		auto metadata_pos = file_size - (footer_len + 8);
		transport.SetLocation(metadata_pos);
		if (footer_len > prefetch_size - 8) {
			transport.Prefetch(metadata_pos, footer_len);
		}
	} else {
		auto footer_len = UnsafeNumericCast<uint32_t>(footer_size.GetIndex());
		if (footer_len == 0 || file_size < 12 + footer_len) {
			throw InvalidInputException("Invalid footer length provided for file '%s'", file_handle.GetPath());
		}

		idx_t total_footer_len = footer_len + 8;
		auto metadata_pos = file_size - total_footer_len;
		transport.SetLocation(metadata_pos);
		transport.Prefetch(metadata_pos, total_footer_len);

		auto read_head = transport.GetReadHead(metadata_pos);
		auto data_ptr = read_head->buffer_ptr;

		uint32_t read_footer_len;
		ParseParquetFooter(data_ptr + footer_len, file_handle.GetPath(), file_size, encryption_config, read_footer_len,
		                   footer_encrypted);
		if (read_footer_len != footer_len) {
			throw InvalidInputException("Parquet footer length stored in file is not equal to footer length provided");
		}
	}

	auto metadata = make_uniq<FileMetaData>();
	if (footer_encrypted) {
		auto crypto_metadata = make_uniq<FileCryptoMetaData>();
		crypto_metadata->read(file_proto.get());
		if (crypto_metadata->encryption_algorithm.__isset.AES_GCM_CTR_V1) {
			throw InvalidInputException("File '%s' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
			                            file_handle.GetPath());
		}
		ParquetCrypto::Read(*metadata, *file_proto, encryption_config->GetFooterKey(), encryption_util);
	} else {
		metadata->read(file_proto.get());
	}

	// Try to read the GeoParquet metadata (if present)
	auto geo_metadata = GeoParquetFileMetadata::TryRead(*metadata, context);

	return make_shared_ptr<ParquetFileMetadataCache>(std::move(metadata), current_time, std::move(geo_metadata));
}